

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_field.h
# Opt level: O1

ImmutableFieldGenerator * __thiscall
google::protobuf::compiler::java::
FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
          (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *this,
          FieldDescriptor *field)

{
  LogMessage *other;
  long *plVar1;
  scoped_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator> *psVar2;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (*(Descriptor **)(field + 0x58) != this->descriptor_) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_field.h"
               ,0x98);
    other = internal::LogMessage::operator<<
                      (&local_60,"CHECK failed: (field->containing_type()) == (descriptor_): ");
    internal::LogFinisher::operator=(&local_61,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  if (field[0x50] == (FieldDescriptor)0x0) {
    plVar1 = (long *)(*(long *)(field + 0x58) + 0x30);
  }
  else if (*(long *)(field + 0x68) == 0) {
    plVar1 = (long *)(*(long *)(field + 0x30) + 0x98);
  }
  else {
    plVar1 = (long *)(*(long *)(field + 0x68) + 0x80);
  }
  psVar2 = internal::
           scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
           ::operator[](&this->field_generators_,
                        (long)((int)((ulong)((long)field - *plVar1) >> 3) * 0x3cf3cf3d));
  if (psVar2->ptr_ != (ImmutableFieldGenerator *)0x0) {
    return psVar2->ptr_;
  }
  __assert_fail("ptr_ != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                ,0x5b,
                "C &google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator>::operator*() const [C = google::protobuf::compiler::java::ImmutableFieldGenerator]"
               );
}

Assistant:

inline const FieldGeneratorType&
FieldGeneratorMap<FieldGeneratorType>::get(const FieldDescriptor* field) const {
  GOOGLE_CHECK_EQ(field->containing_type(), descriptor_);
  return *field_generators_[field->index()];
}